

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void skewness_api_suite::test_size(void)

{
  undefined4 local_ac;
  size_type local_a8;
  undefined4 local_9c;
  size_type local_98;
  undefined4 local_8c;
  size_type local_88;
  undefined4 local_7c;
  size_type local_78;
  undefined4 local_6c;
  size_type local_68;
  undefined4 local_5c;
  size_type local_58 [2];
  undefined1 local_48 [8];
  moment_skewness<double,_4> filter;
  
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)3>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)3> *)local_48);
  local_58[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::size
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>
                            *)local_48);
  local_5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1d5,"void skewness_api_suite::test_size()",local_58,&local_5c);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             1.0);
  local_68 = trial::online::interim::detail::
             basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *
                        )local_48);
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1d7,"void skewness_api_suite::test_size()",&local_68,&local_6c);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             2.0);
  local_78 = trial::online::interim::detail::
             basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *
                        )local_48);
  local_7c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1d9,"void skewness_api_suite::test_size()",&local_78,&local_7c);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             3.0);
  local_88 = trial::online::interim::detail::
             basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *
                        )local_48);
  local_8c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1db,"void skewness_api_suite::test_size()",&local_88,&local_8c);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             4.0);
  local_98 = trial::online::interim::detail::
             basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *
                        )local_48);
  local_9c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1dd,"void skewness_api_suite::test_size()",&local_98,&local_9c);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             5.0);
  local_a8 = trial::online::interim::detail::
             basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::size
                       ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *
                        )local_48);
  local_ac = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1df,"void skewness_api_suite::test_size()",&local_a8,&local_ac);
  return;
}

Assistant:

void test_size()
{
    interim::moment_skewness<double, 4> filter;
    TRIAL_TEST_EQ(filter.size(), 0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    filter.push(2.0);
    TRIAL_TEST_EQ(filter.size(), 2);
    filter.push(3.0);
    TRIAL_TEST_EQ(filter.size(), 3);
    filter.push(4.0);
    TRIAL_TEST_EQ(filter.size(), 4);
    filter.push(5.0);
    TRIAL_TEST_EQ(filter.size(), 4);
}